

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<unsigned_long,_RealCount>::Clear<Memory::HeapAllocator>
          (DListBase<unsigned_long,_RealCount> *this,HeapAllocator *allocator)

{
  DListNode<unsigned_long> *pDVar1;
  DListNode<unsigned_long> *buffer;
  
  buffer = (this->super_DListNodeBase<unsigned_long>).next.node;
  while (buffer != (DListNode<unsigned_long> *)this) {
    pDVar1 = (buffer->super_DListNodeBase<unsigned_long>).next.node;
    Memory::HeapAllocator::Free(allocator,buffer,0x18);
    buffer = pDVar1;
  }
  (this->super_DListNodeBase<unsigned_long>).next.list = this;
  (this->super_DListNodeBase<unsigned_long>).prev.list = this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }